

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-multiple-listen.c
# Opt level: O0

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *puVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  uv_write_t *write_req;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int iStack_10038;
  int r;
  int j;
  int i;
  uv_stream_t *stream;
  uv_buf_t send_bufs [4096];
  int status_local;
  uv_connect_t *req_local;
  
  puVar1 = connect_req.handle;
  if (req != &connect_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x76,"req","==","&connect_req",req,"==",&connect_req);
    abort();
  }
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x77,"status","==","0",(long)status,"==",0);
    abort();
  }
  connect_cb_called = connect_cb_called + 1;
  for (r = 0; r < 3; r = r + 1) {
    for (iStack_10038 = 0; iStack_10038 < 0x1000; iStack_10038 = iStack_10038 + 1) {
      auVar3 = uv_buf_init(send_buffer + bytes_sent,0x2728);
      send_bufs[(long)iStack_10038 + -1].len = auVar3._0_8_;
      send_bufs[iStack_10038].base = auVar3._8_8_;
      bytes_sent = bytes_sent + 0x2728;
    }
    iVar2 = uv_write(write_reqs + r,puVar1,&stream,0x1000,write_cb);
    if ((long)iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
              ,0x86,"r","==","0",(long)iVar2,"==",0);
      abort();
    }
  }
  iVar2 = uv_shutdown(&shutdown_req,puVar1,shutdown_cb);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x8b,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  iVar2 = uv_read_start(puVar1,alloc_cb,read_cb);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x8f,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  return;
}

Assistant:

static void connect_cb(uv_connect_t* req, int status) {
  ASSERT_NOT_NULL(req);
  ASSERT_OK(status);
  free(req);
  uv_close((uv_handle_t*)&client, close_cb);
  connect_cb_called++;
}